

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

char * transform_xml2json(ly_ctx *ctx,char *expr,lyxml_elem *xml,int use_ctx_data_clb,int log)

{
  size_t sVar1;
  char *pcVar2;
  lyxp_expr *expr_00;
  char *pcVar3;
  lyxml_ns *plVar4;
  lys_module *plVar5;
  ushort **ppuVar6;
  size_t sVar7;
  LY_ERR *pLVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  void *pvVar14;
  char *pcVar15;
  long lVar16;
  size_t local_68;
  
  sVar1 = strlen(expr);
  local_68 = sVar1 + 1;
  pcVar2 = (char *)malloc(local_68);
  if (pcVar2 == (char *)0x0) {
    if (log != 0) {
      pLVar8 = ly_errno_location();
      *pLVar8 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
    }
  }
  else {
    expr_00 = lyxp_parse_expr(expr);
    if (expr_00 == (lyxp_expr *)0x0) {
      free(pcVar2);
    }
    else {
      uVar11 = 0;
      pcVar15 = (char *)0x0;
      while( true ) {
        if (expr_00->used <= uVar11) {
          pcVar2[(long)pcVar15] = '\0';
          lyxp_expr_free(expr_00);
          pcVar2 = lydict_insert_zc(ctx,pcVar2);
          return pcVar2;
        }
        pcVar13 = expr_00->expr + expr_00->expr_pos[uVar11];
        if ((uVar11 != 0) &&
           (uVar10 = (int)uVar11 - 1,
           pcVar12 = expr_00->expr +
                     (ulong)expr_00->tok_len[uVar10] + (ulong)expr_00->expr_pos[uVar10],
           pcVar12 != pcVar13)) {
          strncpy(pcVar2 + (long)pcVar15,pcVar12,(long)pcVar13 - (long)pcVar12);
          pcVar15 = pcVar15 + ((long)pcVar13 - (long)pcVar12);
        }
        uVar10 = (uint)expr_00->tok_len[uVar11];
        if (expr_00->tokens[uVar11] == LYXP_TOKEN_LITERAL) break;
        if ((expr_00->tokens[uVar11] == LYXP_TOKEN_NAMETEST) &&
           (pcVar12 = strnchr(pcVar13,0x3a,uVar10), pcVar12 != (char *)0x0)) {
          sVar1 = (long)pcVar12 - (long)pcVar13;
          pcVar3 = strndup(pcVar13,sVar1);
          if (pcVar3 == (char *)0x0) {
            if (log != 0) {
              pLVar8 = ly_errno_location();
              *pLVar8 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
            }
          }
          else {
            plVar4 = lyxml_get_ns(xml,pcVar3);
            free(pcVar3);
            if (plVar4 != (lyxml_ns *)0x0) {
              plVar5 = ly_ctx_get_module_by_ns(ctx,plVar4->value,(char *)0x0);
              if ((use_ctx_data_clb == 0) || (ctx->data_clb == (ly_module_data_clb)0x0)) {
LAB_0010ea57:
                if (plVar5 == (lys_module *)0x0) {
                  if (log != 0) {
                    ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"module namespace");
                    ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                            "Module with the namespace \"%s\" could not be found.",plVar4->value);
                  }
                  goto LAB_0010ecae;
                }
              }
              else {
                if (plVar5 == (lys_module *)0x0) {
                  pcVar3 = plVar4->value;
                  pvVar14 = ctx->data_clb_data;
                  pcVar13 = (char *)0x0;
                  iVar9 = 0;
LAB_0010ea52:
                  plVar5 = (*ctx->data_clb)(ctx,pcVar13,pcVar3,iVar9,pvVar14);
                  goto LAB_0010ea57;
                }
                if (-1 < (char)plVar5->field_0x40) {
                  pcVar13 = plVar5->name;
                  pcVar3 = plVar5->ns;
                  pvVar14 = ctx->data_clb_data;
                  iVar9 = 1;
                  goto LAB_0010ea52;
                }
              }
              sVar7 = strlen(plVar5->name);
              local_68 = local_68 + (sVar7 - sVar1);
              pcVar2 = (char *)ly_realloc(pcVar2,local_68);
              if (pcVar2 == (char *)0x0) goto LAB_0010eb4f;
              strcpy(pcVar2 + (long)pcVar15,plVar5->name);
              sVar7 = strlen(plVar5->name);
              strncpy(pcVar2 + (long)(pcVar15 + sVar7),pcVar12,expr_00->tok_len[uVar11] - sVar1);
              pcVar15 = pcVar15 + sVar7 + (expr_00->tok_len[uVar11] - sVar1);
              goto LAB_0010eae3;
            }
            if (log != 0) {
              ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"namespace prefix");
              ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                      "XML namespace with prefix \"%.*s\" not defined.",sVar1,pcVar13);
            }
          }
          goto LAB_0010ecae;
        }
LAB_0010e8b1:
        pcVar13 = expr_00->expr + expr_00->expr_pos[uVar11];
        sVar1 = (size_t)uVar10;
LAB_0010e8c8:
        strncpy(pcVar2 + (long)pcVar15,pcVar13,sVar1);
        pcVar15 = pcVar15 + expr_00->tok_len[uVar11];
LAB_0010eae3:
        uVar11 = uVar11 + 1;
      }
      pcVar12 = strnchr(pcVar13,0x3a,uVar10);
      if (pcVar12 == (char *)0x0) goto LAB_0010e8b1;
      ppuVar6 = __ctype_b_loc();
      lVar16 = 0;
      while ((((*ppuVar6)[pcVar12[lVar16 + -1]] & 8) != 0 ||
             ((uVar10 = (byte)pcVar12[lVar16 + -1] - 0x2d, uVar10 < 0x33 &&
              ((0x4000000000003U >> ((ulong)uVar10 & 0x3f) & 1) != 0))))) {
        lVar16 = lVar16 + -1;
      }
      sVar1 = (long)pcVar12 - (long)pcVar13;
      pcVar3 = strndup(pcVar13,sVar1);
      if (pcVar3 == (char *)0x0) {
        if (log != 0) {
          pLVar8 = ly_errno_location();
          *pLVar8 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
        }
      }
      else {
        plVar4 = lyxml_get_ns(xml,pcVar3);
        free(pcVar3);
        if (plVar4 == (lyxml_ns *)0x0) {
          if (log != 0) {
            ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"namespace prefix");
            ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                    "XML namespace with prefix \"%.*s\" not defined.",sVar1,pcVar13);
          }
        }
        else {
          plVar5 = ly_ctx_get_module_by_ns(ctx,plVar4->value,(char *)0x0);
          if (plVar5 == (lys_module *)0x0) {
            pcVar13 = expr_00->expr + expr_00->expr_pos[uVar11];
            sVar1 = (size_t)expr_00->tok_len[uVar11];
            goto LAB_0010e8c8;
          }
          sVar7 = strlen(plVar5->name);
          local_68 = local_68 + (sVar7 - sVar1);
          pcVar2 = (char *)ly_realloc(pcVar2,local_68);
          if (pcVar2 != (char *)0x0) {
            strncpy(pcVar2 + (long)pcVar15,pcVar13,sVar1 + lVar16);
            pcVar15 = pcVar12 + (long)(pcVar15 + (lVar16 - (long)pcVar13));
            strcpy(pcVar2 + (long)pcVar15,plVar5->name);
            sVar1 = strlen(plVar5->name);
            strncpy(pcVar2 + (long)pcVar15 + sVar1,pcVar12,
                    ((long)pcVar13 * 2 + (long)pcVar12 * -2 + (ulong)expr_00->tok_len[uVar11]) -
                    lVar16);
            pcVar15 = pcVar15 + (ulong)expr_00->tok_len[uVar11] +
                                (sVar1 - ((long)pcVar12 * 2 + (long)pcVar13 * -2 + lVar16));
            goto LAB_0010eae3;
          }
LAB_0010eb4f:
          if (log == 0) {
            pcVar2 = (char *)0x0;
          }
          else {
            pLVar8 = ly_errno_location();
            *pLVar8 = LY_EMEM;
            pcVar2 = (char *)0x0;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
          }
        }
      }
LAB_0010ecae:
      free(pcVar2);
      lyxp_expr_free(expr_00);
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
transform_xml2json(struct ly_ctx *ctx, const char *expr, struct lyxml_elem *xml, int use_ctx_data_clb, int log)
{
    const char *end, *cur_expr, *ptr;
    char *out, *prefix;
    uint16_t i;
    size_t out_size, out_used, pref_len;
    const struct lys_module *mod;
    const struct lyxml_ns *ns;
    struct lyxp_expr *exp;

    out_size = strlen(expr) + 1;
    out = malloc(out_size);
    if (!out) {
        if (log) {
            LOGMEM;
        }
        return NULL;
    }
    out_used = 0;

    exp = lyxp_parse_expr(expr);
    if (!exp) {
        free(out);
        return NULL;
    }

    for (i = 0; i < exp->used; ++i) {
        cur_expr = &exp->expr[exp->expr_pos[i]];

        /* copy WS */
        if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
            strncpy(&out[out_used], end, cur_expr - end);
            out_used += cur_expr - end;
        }

        if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            /* get the module */
            pref_len = end - cur_expr;
            prefix = strndup(cur_expr, pref_len);
            if (!prefix) {
                if (log) {
                    LOGMEM;
                }
                goto error;
            }
            ns = lyxml_get_ns(xml, prefix);
            free(prefix);
            if (!ns) {
                if (log) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "namespace prefix");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL,
                        "XML namespace with prefix \"%.*s\" not defined.", pref_len, cur_expr);
                }
                goto error;
            }
            mod = ly_ctx_get_module_by_ns(ctx, ns->value, NULL);
            if (use_ctx_data_clb && ctx->data_clb) {
                if (!mod) {
                    mod = ctx->data_clb(ctx, NULL, ns->value, 0, ctx->data_clb_data);
                } else if (!mod->implemented) {
                    mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
                }
            }
            if (!mod) {
                if (log) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "module namespace");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL,
                        "Module with the namespace \"%s\" could not be found.", ns->value);
                }
                goto error;
            }

            /* adjust out size (it can even decrease in some strange cases) */
            out_size += strlen(mod->name) - pref_len;
            out = ly_realloc(out, out_size);
            if (!out) {
                if (log) {
                    LOGMEM;
                }
                goto error;
            }

            /* copy the model name */
            strcpy(&out[out_used], mod->name);
            out_used += strlen(mod->name);

            /* copy the rest */
            strncpy(&out[out_used], end, exp->tok_len[i] - pref_len);
            out_used += exp->tok_len[i] - pref_len;
        } else if ((exp->tokens[i] == LYXP_TOKEN_LITERAL) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            ptr = end;
            while (isalnum(ptr[-1]) || (ptr[-1] == '_') || (ptr[-1] == '-') || (ptr[-1] == '.')) {
                --ptr;
            }

            /* get the module */
            pref_len = end - cur_expr;
            prefix = strndup(cur_expr, pref_len);
            if (!prefix) {
                if (log) {
                    LOGMEM;
                }
                goto error;
            }
            ns = lyxml_get_ns(xml, prefix);
            free(prefix);
            if (!ns) {
                if (log) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "namespace prefix");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL,
                        "XML namespace with prefix \"%.*s\" not defined.", pref_len, cur_expr);
                }
                goto error;
            }
            mod = ly_ctx_get_module_by_ns(ctx, ns->value, NULL);
            if (mod) {
                /* adjust out size (it can even decrease in some strange cases) */
                out_size += strlen(mod->name) - pref_len;
                out = ly_realloc(out, out_size);
                if (!out) {
                    if (log) {
                        LOGMEM;
                    }
                    goto error;
                }

                /* copy any beginning */
                strncpy(&out[out_used], cur_expr, ptr - cur_expr);
                out_used += ptr - cur_expr;

                /* copy the model name */
                strcpy(&out[out_used], mod->name);
                out_used += strlen(mod->name);

                /* copy the rest */
                strncpy(&out[out_used], end, (exp->tok_len[i] - pref_len) - (ptr - cur_expr));
                out_used += (exp->tok_len[i] - pref_len) - (ptr - cur_expr);
            } else {
                strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                out_used += exp->tok_len[i];
            }
        } else {
            strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
            out_used += exp->tok_len[i];
        }
    }
    out[out_used] = '\0';

    lyxp_expr_free(exp);
    return lydict_insert_zc(ctx, out);

error:
    free(out);
    lyxp_expr_free(exp);
    return NULL;
}